

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::GPBGenericValueFieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  CppType CVar1;
  Type TVar2;
  LogMessage *other;
  char *pcVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  if ((~(byte)this[1] & 0x60) == 0) {
switchD_002ae74f_caseD_a:
    pcVar3 = "valueMessage";
  }
  else {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
    switch(CVar1) {
    case CPPTYPE_INT32:
      pcVar3 = "valueInt32";
      break;
    case CPPTYPE_INT64:
      pcVar3 = "valueInt64";
      break;
    case CPPTYPE_UINT32:
      pcVar3 = "valueUInt32";
      break;
    case CPPTYPE_UINT64:
      pcVar3 = "valueUInt64";
      break;
    case CPPTYPE_DOUBLE:
      pcVar3 = "valueDouble";
      break;
    case CPPTYPE_FLOAT:
      pcVar3 = "valueFloat";
      break;
    case CPPTYPE_BOOL:
      pcVar3 = "valueBool";
      break;
    case CPPTYPE_ENUM:
      pcVar3 = "valueEnum";
      break;
    case CPPTYPE_STRING:
      TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
      if (TVar2 == TYPE_BYTES) {
        pcVar3 = "valueData";
      }
      else {
        pcVar3 = "valueString";
      }
      break;
    case CPPTYPE_MESSAGE:
      goto switchD_002ae74f_caseD_a;
    default:
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
                 ,0x3ad);
      other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
      internal::LogFinisher::operator=(&local_49,other);
      internal::LogMessage::~LogMessage(&local_48);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GPBGenericValueFieldName(const FieldDescriptor* field) {
  // Returns the field within the GPBGenericValue union to use for the given
  // field.
  if (field->is_repeated()) {
      return "valueMessage";
  }
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return "valueInt32";
    case FieldDescriptor::CPPTYPE_UINT32:
      return "valueUInt32";
    case FieldDescriptor::CPPTYPE_INT64:
      return "valueInt64";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "valueUInt64";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "valueFloat";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "valueDouble";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "valueBool";
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        return "valueData";
      } else {
        return "valueString";
      }
    case FieldDescriptor::CPPTYPE_ENUM:
      return "valueEnum";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "valueMessage";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return std::string();
}